

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

xmlNodePtr
xmlXIncludeCopyNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr elem,int copyChildren,xmlChar *targetBase)

{
  int iVar1;
  xmlXIncludeRefPtr pxVar2;
  xmlNodePtr pxVar3;
  bool bVar4;
  xmlXIncludeRefPtr ref;
  int recurse;
  xmlNodePtr copy;
  xmlNodePtr pxStack_58;
  int depth;
  xmlNodePtr item;
  xmlNodePtr cur;
  xmlNodePtr insertLast;
  xmlNodePtr insertParent;
  xmlNodePtr result;
  xmlChar *targetBase_local;
  int copyChildren_local;
  xmlNodePtr elem_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  insertParent = (xmlNodePtr)0x0;
  insertLast = (xmlNodePtr)0x0;
  cur = (xmlNodePtr)0x0;
  copy._4_4_ = 0;
  item = elem;
  if ((copyChildren == 0) || (item = elem->children, item != (_xmlNode *)0x0)) {
LAB_0021bc6b:
    bVar4 = false;
    if ((item->type != XML_DOCUMENT_NODE) && (item->type != XML_DTD_NODE)) {
      if ((((item->type == XML_ELEMENT_NODE) && (item->ns != (xmlNs *)0x0)) &&
          (iVar1 = xmlStrEqual(item->name,(xmlChar *)"include"), iVar1 != 0)) &&
         ((iVar1 = xmlStrEqual(item->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
          iVar1 != 0 ||
          (iVar1 = xmlStrEqual(item->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
          iVar1 != 0)))) {
        pxVar2 = xmlXIncludeExpandNode(ctxt,item);
        if (pxVar2 == (xmlXIncludeRefPtr)0x0) {
LAB_0021bf7b:
          xmlFreeNodeList(insertParent);
          return (xmlNodePtr)0x0;
        }
        for (pxStack_58 = pxVar2->inc; pxStack_58 != (xmlNodePtr)0x0; pxStack_58 = pxStack_58->next)
        {
          pxVar3 = xmlStaticCopyNode(pxStack_58,ctxt->doc,insertLast,1);
          if (pxVar3 == (xmlNodePtr)0x0) {
            xmlXIncludeErrMemory(ctxt);
            goto LAB_0021bf7b;
          }
          if (insertParent == (xmlNodePtr)0x0) {
            insertParent = pxVar3;
          }
          if (cur == (xmlNodePtr)0x0) {
            if (insertLast != (xmlNodePtr)0x0) {
              insertLast->children = pxVar3;
            }
          }
          else {
            cur->next = pxVar3;
            pxVar3->prev = cur;
          }
          if ((copy._4_4_ == 0) && (targetBase != (xmlChar *)0x0)) {
            xmlXIncludeBaseFixup(ctxt,pxStack_58,pxVar3,targetBase);
          }
          cur = pxVar3;
        }
      }
      else {
        pxVar3 = xmlStaticCopyNode(item,ctxt->doc,insertLast,2);
        if (pxVar3 == (xmlNodePtr)0x0) {
          xmlXIncludeErrMemory(ctxt);
          goto LAB_0021bf7b;
        }
        if (insertParent == (xmlNodePtr)0x0) {
          insertParent = pxVar3;
        }
        if (cur == (xmlNodePtr)0x0) {
          if (insertLast != (xmlNodePtr)0x0) {
            insertLast->children = pxVar3;
          }
        }
        else {
          cur->next = pxVar3;
          pxVar3->prev = cur;
        }
        if ((copy._4_4_ == 0) && (targetBase != (xmlChar *)0x0)) {
          xmlXIncludeBaseFixup(ctxt,item,pxVar3,targetBase);
        }
        bVar4 = false;
        cur = pxVar3;
        if (item->type != XML_ENTITY_REF_NODE) {
          bVar4 = item->children != (_xmlNode *)0x0;
        }
      }
    }
    if (bVar4) {
      item = item->children;
      insertLast = cur;
      cur = (xmlNodePtr)0x0;
      copy._4_4_ = copy._4_4_ + 1;
      goto LAB_0021bc6b;
    }
    if (item != elem) {
      while (item->next == (_xmlNode *)0x0) {
        if (insertLast != (xmlNodePtr)0x0) {
          insertLast->last = cur;
        }
        item = item->parent;
        if (item == elem) {
          return insertParent;
        }
        cur = insertLast;
        insertLast = insertLast->parent;
        copy._4_4_ = copy._4_4_ + -1;
      }
      item = item->next;
      goto LAB_0021bc6b;
    }
    ctxt_local = (xmlXIncludeCtxtPtr)insertParent;
  }
  else {
    ctxt_local = (xmlXIncludeCtxtPtr)0x0;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

static xmlNodePtr
xmlXIncludeCopyNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr elem,
                    int copyChildren, const xmlChar *targetBase) {
    xmlNodePtr result = NULL;
    xmlNodePtr insertParent = NULL;
    xmlNodePtr insertLast = NULL;
    xmlNodePtr cur;
    xmlNodePtr item;
    int depth = 0;

    if (copyChildren) {
        cur = elem->children;
        if (cur == NULL)
            return(NULL);
    } else {
        cur = elem;
    }

    while (1) {
        xmlNodePtr copy = NULL;
        int recurse = 0;

        if ((cur->type == XML_DOCUMENT_NODE) ||
            (cur->type == XML_DTD_NODE)) {
            ;
        } else if ((cur->type == XML_ELEMENT_NODE) &&
                   (cur->ns != NULL) &&
                   (xmlStrEqual(cur->name, XINCLUDE_NODE)) &&
                   ((xmlStrEqual(cur->ns->href, XINCLUDE_NS)) ||
                    (xmlStrEqual(cur->ns->href, XINCLUDE_OLD_NS)))) {
            xmlXIncludeRefPtr ref = xmlXIncludeExpandNode(ctxt, cur);

            if (ref == NULL)
                goto error;
            /*
             * TODO: Insert XML_XINCLUDE_START and XML_XINCLUDE_END nodes
             */
            for (item = ref->inc; item != NULL; item = item->next) {
                copy = xmlStaticCopyNode(item, ctxt->doc, insertParent, 1);
                if (copy == NULL) {
                    xmlXIncludeErrMemory(ctxt);
                    goto error;
                }

                if (result == NULL)
                    result = copy;
                if (insertLast != NULL) {
                    insertLast->next = copy;
                    copy->prev = insertLast;
                } else if (insertParent != NULL) {
                    insertParent->children = copy;
                }
                insertLast = copy;

                if ((depth == 0) && (targetBase != NULL))
                    xmlXIncludeBaseFixup(ctxt, item, copy, targetBase);
            }
        } else {
            copy = xmlStaticCopyNode(cur, ctxt->doc, insertParent, 2);
            if (copy == NULL) {
                xmlXIncludeErrMemory(ctxt);
                goto error;
            }

            if (result == NULL)
                result = copy;
            if (insertLast != NULL) {
                insertLast->next = copy;
                copy->prev = insertLast;
            } else if (insertParent != NULL) {
                insertParent->children = copy;
            }
            insertLast = copy;

            if ((depth == 0) && (targetBase != NULL))
                xmlXIncludeBaseFixup(ctxt, cur, copy, targetBase);

            recurse = (cur->type != XML_ENTITY_REF_NODE) &&
                      (cur->children != NULL);
        }

        if (recurse) {
            cur = cur->children;
            insertParent = insertLast;
            insertLast = NULL;
            depth += 1;
            continue;
        }

        if (cur == elem)
            return(result);

        while (cur->next == NULL) {
            if (insertParent != NULL)
                insertParent->last = insertLast;
            cur = cur->parent;
            if (cur == elem)
                return(result);
            insertLast = insertParent;
            insertParent = insertParent->parent;
            depth -= 1;
        }

        cur = cur->next;
    }

error:
    xmlFreeNodeList(result);
    return(NULL);
}